

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPMuxError MuxImageDeleteNth(WebPMuxImage **wpi_list,uint32_t nth)

{
  WebPMuxImage *current;
  WebPMuxImage *pWVar1;
  WebPMuxImage *pWVar2;
  WebPMuxImage **ppWVar3;
  WebPMuxImage **ppWVar4;
  bool bVar5;
  
  ppWVar4 = wpi_list;
  if (nth == 0) {
    nth = 0;
    for (pWVar1 = *wpi_list; pWVar1 != (WebPMuxImage *)0x0; pWVar1 = pWVar1->next) {
      nth = nth + 1;
    }
    if (nth == 0) {
      bVar5 = true;
      goto LAB_00106986;
    }
  }
  do {
    bVar5 = *wpi_list == (WebPMuxImage *)0x0;
    if (bVar5) break;
    ppWVar3 = &(*wpi_list)->next;
    if (nth != 1) {
      wpi_list = ppWVar3;
      ppWVar4 = ppWVar3;
    }
    nth = nth - 1;
  } while (nth != 0);
LAB_00106986:
  if (!bVar5) {
    pWVar1 = *ppWVar4;
    pWVar2 = MuxImageRelease(pWVar1);
    WebPSafeFree(pWVar1);
    *ppWVar4 = pWVar2;
  }
  return (uint)!bVar5;
}

Assistant:

WebPMuxError MuxImageDeleteNth(WebPMuxImage** wpi_list, uint32_t nth) {
  assert(wpi_list);
  if (!SearchImageToGetOrDelete(wpi_list, nth, &wpi_list)) {
    return WEBP_MUX_NOT_FOUND;
  }
  *wpi_list = MuxImageDelete(*wpi_list);
  return WEBP_MUX_OK;
}